

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O3

ssize_t __thiscall sisl::utility::ply_mesh::write(ply_mesh *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ostream *poVar7;
  pointer pvVar8;
  pointer ptVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  bool bVar12;
  _p p;
  ofstream fp;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,*(char **)CONCAT44(in_register_00000034,__fd),_S_out|_S_bin);
  iVar1 = *(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18));
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ply",3);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"format binary_little_endian 1.0",0x1f);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"element vertex ",0xf);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property float x",0x10);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property float y",0x10);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property float z",0x10);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property float nx",0x11);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property float ny",0x11);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property float nz",0x11);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"element face ",0xd);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"property list uchar int vertex_indices",0x26);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"end_header",10);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    pvVar8 = (this->verts).super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->verts).super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl.
        super__Vector_impl_data._M_finish != pvVar8) {
      uVar10 = 0;
      uVar11 = 1;
      do {
        uVar4 = pvVar8[uVar10].p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar4 < 1) {
LAB_0014a8c8:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        pvVar8 = pvVar8 + uVar10;
        pdVar5 = (pvVar8->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        local_248 = (float)*pdVar5;
        if ((uVar4 == 1) || (local_244 = (float)pdVar5[1], uVar4 < 3)) goto LAB_0014a8c8;
        local_240 = (float)pdVar5[2];
        uVar10 = (pvVar8->n).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)uVar10 < 1) goto LAB_0014a8c8;
        pdVar5 = (pvVar8->n).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        local_23c = (float)*pdVar5;
        if ((uVar10 == 1) || (local_238 = (float)pdVar5[1], uVar10 < 3)) goto LAB_0014a8c8;
        local_234 = (float)pdVar5[2];
        std::ostream::write((char *)&local_230,(long)&local_248);
        pvVar8 = (this->verts).super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar12 = uVar11 < (ulong)((long)(this->verts).
                                        super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >>
                                 5);
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar12);
    }
    ptVar9 = (this->faces).
             super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->faces).
        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != ptVar9) {
      uVar10 = 0;
      uVar11 = 1;
      do {
        iVar2 = ptVar9[uVar10].super__Tuple_impl<0UL,_int,_int,_int>.
                super__Head_base<0UL,_int,_false>._M_head_impl;
        local_248 = (float)CONCAT31((int3)iVar2,3);
        iVar3 = ptVar9[uVar10].super__Tuple_impl<0UL,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        local_244._1_3_ = (undefined3)iVar3;
        local_244 = (float)CONCAT31(local_244._1_3_,(char)((uint)iVar2 >> 0x18));
        iVar2 = ptVar9[uVar10].super__Tuple_impl<0UL,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl;
        local_240._1_3_ = (undefined3)iVar2;
        local_240 = (float)CONCAT31(local_240._1_3_,(char)((uint)iVar3 >> 0x18));
        local_23c._0_1_ = (undefined1)((uint)iVar2 >> 0x18);
        std::ostream::write((char *)&local_230,(long)&local_248);
        ptVar9 = (this->faces).
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = ((long)(this->faces).
                        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar9 >> 2) *
                 -0x5555555555555555;
        bVar12 = uVar11 <= uVar10;
        lVar6 = uVar10 - uVar11;
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar12 && lVar6 != 0);
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _setbuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return CONCAT71((int7)((ulong)this >> 8),iVar1 == 0) & 0xffffffff;
}

Assistant:

bool write(const std::string &out) const {
            using namespace std;

            ofstream fp(out.c_str(), ios::out | ios::binary);
            if(!fp.good()) return false;

            // We're going to output in binary, but all PLY
            // files have an ascii header
            fp << "ply" << endl;
            fp << "format binary_little_endian 1.0" << endl;
            fp << "element vertex " << verts.size() << endl;
            fp << "property float x" << endl;
            fp << "property float y" << endl;
            fp << "property float z" << endl;
            fp << "property float nx" << endl;
            fp << "property float ny" << endl;
            fp << "property float nz" << endl;
            fp << "element face " << faces.size() << endl;
            fp << "property list uchar int vertex_indices" << endl;
            fp << "end_header" << endl;

            for(unsigned int i = 0; i < verts.size(); i++) {
                struct _p {
                    float x, y, z, i, j , k;
                }__attribute__ ((packed)) p;

                p.x = verts[i].p[0];
                p.y = verts[i].p[1];
                p.z = verts[i].p[2];
                p.i = verts[i].n[0];
                p.j = verts[i].n[1];
                p.k = verts[i].n[2];
                fp.write((char*)&p, sizeof(_p));
            }

            for(unsigned int i = 0; i < faces.size(); i++) {
                struct _f {
                    char t;
                    int i,j,k;
                } __attribute__ ((packed)) f;

                f.t = 3;
                f.i = std::get<0>(faces[i]);
                f.j = std::get<1>(faces[i]);
                f.k = std::get<2>(faces[i]);
                fp.write((char*)&f, sizeof(_f));
            }
            fp.close();
            return true;
        }